

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O2

int __thiscall S2CopyingEdgeCrosser::CrossingSign(S2CopyingEdgeCrosser *this,S2Point *d)

{
  VType VVar1;
  int iVar2;
  
  iVar2 = S2EdgeCrosser::CrossingSign(&this->crosser_,d);
  VVar1 = d->c_[1];
  (this->c_).c_[0] = d->c_[0];
  (this->c_).c_[1] = VVar1;
  (this->c_).c_[2] = d->c_[2];
  (this->crosser_).c_ = &this->c_;
  return iVar2;
}

Assistant:

inline int S2CopyingEdgeCrosser::CrossingSign(const S2Point& d) {
  int result = crosser_.CrossingSign(&d);
  c_ = d;
  crosser_.set_c(&c_);
  return result;
}